

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator>>
          (ChFrame<double> *__return_storage_ptr__,ChFrame<double> *this,ChFrame<double> *Fb)

{
  ChQuaternion<double> local_60;
  ChVector<double> local_40;
  undefined1 local_21;
  ChFrame<double> *local_20;
  ChFrame<double> *Fb_local;
  ChFrame<double> *this_local;
  ChFrame<double> *res;
  
  local_21 = 0;
  local_20 = Fb;
  Fb_local = this;
  this_local = __return_storage_ptr__;
  ChVector<double>::ChVector(&local_40,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_60,1.0,0.0,0.0,0.0);
  ChFrame(__return_storage_ptr__,&local_40,&local_60);
  TransformLocalToParent(local_20,this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<Real> operator>>(const ChFrame<Real>& Fb) const {
        ChFrame<Real> res;
        Fb.TransformLocalToParent(*this, res);
        return res;
    }